

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O2

IOTHUB_MESSAGE_RESULT
IoTHubMessage_SetMessageId(IOTHUB_MESSAGE_HANDLE iotHubMessageHandle,char *messageId)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  IOTHUB_MESSAGE_RESULT IVar3;
  
  if (iotHubMessageHandle == (IOTHUB_MESSAGE_HANDLE)0x0 || messageId == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      IVar3 = IOTHUB_MESSAGE_INVALID_ARG;
    }
    else {
      IVar3 = IOTHUB_MESSAGE_INVALID_ARG;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                ,"IoTHubMessage_SetMessageId",0x283,1,
                "invalid arg (NULL) passed to IoTHubMessage_SetMessageId");
    }
  }
  else {
    if (iotHubMessageHandle->messageId != (char *)0x0) {
      free(iotHubMessageHandle->messageId);
      iotHubMessageHandle->messageId = (char *)0x0;
    }
    iVar1 = mallocAndStrcpy_s(&iotHubMessageHandle->messageId,messageId);
    IVar3 = (uint)(iVar1 != 0) * 3;
  }
  return IVar3;
}

Assistant:

IOTHUB_MESSAGE_RESULT IoTHubMessage_SetMessageId(IOTHUB_MESSAGE_HANDLE iotHubMessageHandle, const char* messageId)
{
    IOTHUB_MESSAGE_RESULT result;
    if (iotHubMessageHandle == NULL || messageId == NULL)
    {
        LogError("invalid arg (NULL) passed to IoTHubMessage_SetMessageId");
        result = IOTHUB_MESSAGE_INVALID_ARG;
    }
    else
    {
        IOTHUB_MESSAGE_HANDLE_DATA* handleData = iotHubMessageHandle;
        if (handleData->messageId != NULL)
        {
            free(handleData->messageId);
            handleData->messageId = NULL;
        }

        if (mallocAndStrcpy_s(&handleData->messageId, messageId) != 0)
        {
            result = IOTHUB_MESSAGE_ERROR;
        }
        else
        {
            result = IOTHUB_MESSAGE_OK;
        }
    }
    return result;
}